

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

void duckdb_yyjson::yyjson_alc_dyn_free(yyjson_alc *alc)

{
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var1;
  void *pvVar2;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *__ptr;
  void *__ptr_00;
  
  if (alc == (yyjson_alc *)0x0) {
    return;
  }
  __ptr = alc[1].realloc;
  while (__ptr != (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0) {
    p_Var1 = *(_func_void_ptr_void_ptr_void_ptr_size_t_size_t **)(__ptr + 8);
    free(__ptr);
    __ptr = p_Var1;
  }
  __ptr_00 = alc[1].ctx;
  while (__ptr_00 != (void *)0x0) {
    pvVar2 = *(void **)((long)__ptr_00 + 8);
    free(__ptr_00);
    __ptr_00 = pvVar2;
  }
  free(alc);
  return;
}

Assistant:

void yyjson_alc_dyn_free(yyjson_alc *alc) {
    const yyjson_alc def = YYJSON_DEFAULT_ALC;
    dyn_ctx *ctx = (dyn_ctx *)(void *)(alc + 1);
    dyn_chunk *chunk, *next;
    if (unlikely(!alc)) return;
    for (chunk = ctx->free_list.next; chunk; chunk = next) {
        next = chunk->next;
        def.free(def.ctx, chunk);
    }
    for (chunk = ctx->used_list.next; chunk; chunk = next) {
        next = chunk->next;
        def.free(def.ctx, chunk);
    }
    def.free(def.ctx, alc);
}